

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::NotImplementedException::
NotImplementedException<char_const*,char_const*,std::__cxx11::string>
          (NotImplementedException *this,string *msg,char *params,char *params_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string sStack_68;
  string local_48 [32];
  
  ::std::__cxx11::string::string(local_48,(string *)params_2);
  Exception::ConstructMessage<char_const*,char_const*,std::__cxx11::string>
            (&sStack_68,(Exception *)msg,(string *)params,params_1,(char *)local_48,in_R9);
  NotImplementedException(this,&sStack_68);
  ::std::__cxx11::string::~string((string *)&sStack_68);
  ::std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

explicit NotImplementedException(const string &msg, ARGS... params)
	    : NotImplementedException(ConstructMessage(msg, params...)) {
	}